

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

void __thiscall
ON_ClippingPlane::SetParticipationLists
          (ON_ClippingPlane *this,ON_SimpleArray<ON_UUID_struct> *objectIds,
          ON_SimpleArray<int> *layerIndices,bool isExclusionList)

{
  int *piVar1;
  bool bVar2;
  ON_ClippingPlaneData *pOVar3;
  long lVar4;
  int i;
  long lVar5;
  ON_UUID uuid;
  
  if ((objectIds == (ON_SimpleArray<ON_UUID_struct> *)0x0) || (objectIds->m_count < 1)) {
    if (layerIndices == (ON_SimpleArray<int> *)0x0) {
      if (!isExclusionList) goto LAB_0057b374;
    }
    else if (0 < layerIndices->m_count || !isExclusionList) goto LAB_0057b374;
    pOVar3 = GetClippingPlaneData((this->m_data_store).m_sn);
    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
      ON_UuidList::Empty(&pOVar3->m_object_id_list);
      piVar1 = (pOVar3->m_layer_list).m_a;
      if (piVar1 != (int *)0x0) {
        memset(piVar1,0,(long)(pOVar3->m_layer_list).m_capacity << 2);
      }
      (pOVar3->m_layer_list).m_count = 0;
      pOVar3->m_layer_list_is_sorted = true;
      pOVar3->m_is_exclusion_list = isExclusionList;
      bVar2 = ON_ClippingPlaneData::HasDefaultContent(pOVar3);
      if (bVar2) {
        DeleteClippingPlaneData(&this->m_data_store);
        return;
      }
    }
  }
  else {
LAB_0057b374:
    pOVar3 = GetClippingPlaneData(&this->m_data_store,SUB81(objectIds,0));
    if (pOVar3 != (ON_ClippingPlaneData *)0x0) {
      ON_UuidList::Empty(&pOVar3->m_object_id_list);
      piVar1 = (pOVar3->m_layer_list).m_a;
      if (piVar1 != (int *)0x0) {
        memset(piVar1,0,(long)(pOVar3->m_layer_list).m_capacity << 2);
      }
      (pOVar3->m_layer_list).m_count = 0;
      pOVar3->m_layer_list_is_sorted = true;
      if (objectIds != (ON_SimpleArray<ON_UUID_struct> *)0x0) {
        lVar4 = 8;
        for (lVar5 = 0; lVar5 < objectIds->m_count; lVar5 = lVar5 + 1) {
          uuid.Data4 = *(uchar (*) [8])(objectIds->m_a->Data4 + lVar4 + -8);
          uuid._0_8_ = *(undefined8 *)(objectIds->m_a->Data4 + lVar4 + -0x10);
          ON_UuidList::AddUuid(&pOVar3->m_object_id_list,uuid,true);
          lVar4 = lVar4 + 0x10;
        }
      }
      if ((layerIndices != (ON_SimpleArray<int> *)0x0) && (0 < layerIndices->m_count)) {
        pOVar3->m_layer_list_is_sorted = false;
        ON_SimpleArray<int>::operator=(&pOVar3->m_layer_list,layerIndices);
      }
      pOVar3->m_is_exclusion_list = isExclusionList;
    }
  }
  return;
}

Assistant:

void ON_ClippingPlane::SetParticipationLists(const ON_SimpleArray<ON_UUID>* objectIds, const ON_SimpleArray<int>* layerIndices, bool isExclusionList)
{
  if ((nullptr == objectIds || objectIds->Count() < 1) &&
    (nullptr==layerIndices || layerIndices->Count()<1) &&
    isExclusionList)
  {
    // clear any existing list
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);
    if (data)
    {
      data->m_object_id_list.Empty();
      data->m_layer_list.Empty();
      data->m_layer_list_is_sorted = true;
      data->m_is_exclusion_list = isExclusionList;
      if (data->HasDefaultContent())
      {
        DeleteClippingPlaneData(m_data_store);
      }
    }
    return;
  }

  ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
  if (data)
  {
    data->m_object_id_list.Empty();
    data->m_layer_list.Empty();
    data->m_layer_list_is_sorted = true;
    if (objectIds)
    {
      for (int i = 0; i < objectIds->Count(); i++)
      {
        data->m_object_id_list.AddUuid((*objectIds)[i]);
      }
    }
    if (layerIndices && layerIndices->Count() > 0)
    {
      data->m_layer_list_is_sorted = false;
      data->m_layer_list = (*layerIndices);
    }
    data->m_is_exclusion_list = isExclusionList;
  }
}